

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void av1_idct8_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i _in0;
  undefined1 auVar4 [16];
  __m128i alVar5;
  __m128i _in1_1;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i _in0_1;
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i _in1_7;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i _in0_3;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  __m128i _in0_2;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i _in1_2;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  __m128i _in1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i _in1_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  undefined1 auVar35 [16];
  undefined1 auVar30 [16];
  undefined1 auVar36 [16];
  undefined1 auVar31 [16];
  undefined1 auVar37 [16];
  
  alVar5 = input[5];
  alVar1 = *input;
  alVar2 = input[1];
  alVar3 = input[2];
  auVar11._0_12_ = alVar2._0_12_;
  auVar11._12_2_ = alVar2[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar2._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar4._10_6_ = auVar10._10_6_;
  auVar4._0_8_ = alVar2[0];
  auVar4._8_2_ = alVar2[0]._4_2_;
  auVar9._8_8_ = auVar4._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar9._4_2_ = alVar2[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar2[0];
  auVar9._2_2_ = (short)input[7][0];
  auVar47._2_2_ = (short)input[7][1];
  auVar47._0_2_ = (short)alVar2[1];
  auVar47._4_2_ = alVar2[1]._2_2_;
  auVar47._6_2_ = *(undefined2 *)((long)input[7] + 10);
  auVar47._8_2_ = alVar2[1]._4_2_;
  auVar47._10_2_ = *(undefined2 *)((long)input[7] + 0xc);
  auVar47._12_2_ = alVar2[1]._6_2_;
  auVar47._14_2_ = *(undefined2 *)((long)input[7] + 0xe);
  auVar43._8_4_ = 0xf04f031f;
  auVar43._0_8_ = 0xf04f031ff04f031f;
  auVar43._12_4_ = 0xf04f031f;
  auVar4 = pmaddwd(auVar9,auVar43);
  auVar44 = pmaddwd(auVar43,auVar47);
  auVar39._8_4_ = 0x31f0fb1;
  auVar39._0_8_ = 0x31f0fb1031f0fb1;
  auVar39._12_4_ = 0x31f0fb1;
  auVar12 = pmaddwd(auVar9,auVar39);
  auVar6 = pmaddwd(auVar47,auVar39);
  auVar7._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar7,auVar45);
  auVar13._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar13,auVar44);
  auVar32._0_12_ = alVar5._0_12_;
  auVar32._12_2_ = alVar5[0]._6_2_;
  auVar32._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar41._12_4_ = auVar32._12_4_;
  auVar41._0_10_ = alVar5._0_10_;
  auVar41._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar52._10_6_ = auVar41._10_6_;
  auVar52._0_8_ = alVar5[0];
  auVar52._8_2_ = alVar5[0]._4_2_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar54._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar54._4_2_ = alVar5[0]._2_2_;
  auVar54._0_2_ = (undefined2)alVar5[0];
  auVar54._2_2_ = (short)input[3][0];
  auVar16._2_2_ = (short)input[3][1];
  auVar16._0_2_ = (short)alVar5[1];
  auVar16._4_2_ = alVar5[1]._2_2_;
  auVar16._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar16._8_2_ = alVar5[1]._4_2_;
  auVar16._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar16._12_2_ = alVar5[1]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar46._8_4_ = 0xf71c0d4e;
  auVar46._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar46._12_4_ = 0xf71c0d4e;
  auVar39 = pmaddwd(auVar54,auVar46);
  auVar47 = pmaddwd(auVar46,auVar16);
  auVar50._8_4_ = 0xd4e08e4;
  auVar50._0_8_ = 0xd4e08e40d4e08e4;
  auVar50._12_4_ = 0xd4e08e4;
  auVar7 = pmaddwd(auVar54,auVar50);
  auVar12 = pmaddwd(auVar16,auVar50);
  auVar40._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar41 = packssdw(auVar40,auVar48);
  auVar8._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar8,auVar17);
  auVar21._0_12_ = alVar1._0_12_;
  auVar21._12_2_ = alVar1[0]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = alVar1._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = alVar1[0];
  auVar19._8_2_ = alVar1[0]._4_2_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar18._4_2_ = alVar1[0]._2_2_;
  auVar18._0_2_ = (undefined2)alVar1[0];
  auVar18._2_2_ = (short)input[4][0];
  auVar26._2_2_ = (short)input[4][1];
  auVar26._0_2_ = (short)alVar1[1];
  auVar26._4_2_ = alVar1[1]._2_2_;
  auVar26._6_2_ = *(undefined2 *)((long)input[4] + 10);
  auVar26._8_2_ = alVar1[1]._4_2_;
  auVar26._10_2_ = *(undefined2 *)((long)input[4] + 0xc);
  auVar26._12_2_ = alVar1[1]._6_2_;
  auVar26._14_2_ = *(undefined2 *)((long)input[4] + 0xe);
  auVar49._8_4_ = 0xb500b50;
  auVar49._0_8_ = 0xb500b500b500b50;
  auVar49._12_4_ = 0xb500b50;
  auVar39 = pmaddwd(auVar18,auVar49);
  auVar44 = pmaddwd(auVar26,auVar49);
  auVar57._8_4_ = 0xf4b00b50;
  auVar57._0_8_ = 0xf4b00b50f4b00b50;
  auVar57._12_4_ = 0xf4b00b50;
  auVar12 = pmaddwd(auVar18,auVar57);
  auVar47 = pmaddwd(auVar26,auVar57);
  auVar23._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar39 = packssdw(auVar23,auVar51);
  auVar22._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar44 = packssdw(auVar22,auVar27);
  auVar31._0_12_ = alVar3._0_12_;
  auVar31._12_2_ = alVar3[0]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = alVar3._0_10_;
  auVar30._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = alVar3[0];
  auVar29._8_2_ = alVar3[0]._4_2_;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar28._4_2_ = alVar3[0]._2_2_;
  auVar28._0_2_ = (undefined2)alVar3[0];
  auVar28._2_2_ = (short)input[6][0];
  auVar14._2_2_ = (short)input[6][1];
  auVar14._0_2_ = (short)alVar3[1];
  auVar14._4_2_ = alVar3[1]._2_2_;
  auVar14._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar14._8_2_ = alVar3[1]._4_2_;
  auVar14._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar14._12_2_ = alVar3[1]._6_2_;
  auVar14._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar24._8_4_ = 0xf138061f;
  auVar24._0_8_ = 0xf138061ff138061f;
  auVar24._12_4_ = 0xf138061f;
  auVar52 = pmaddwd(auVar28,auVar24);
  auVar47 = pmaddwd(auVar24,auVar14);
  auVar58._8_4_ = 0x61f0ec8;
  auVar58._0_8_ = 0x61f0ec8061f0ec8;
  auVar58._12_4_ = 0x61f0ec8;
  auVar32 = pmaddwd(auVar28,auVar58);
  auVar12 = pmaddwd(auVar14,auVar58);
  auVar53._0_4_ = auVar52._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar52._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar52._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar52._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar54 = packssdw(auVar53,auVar25);
  auVar33._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar12 = packssdw(auVar33,auVar15);
  auVar47 = paddsw(auVar4,auVar41);
  auVar4 = psubsw(auVar4,auVar41);
  auVar52 = psubsw(auVar6,auVar7);
  auVar7 = paddsw(auVar7,auVar6);
  auVar41 = paddsw(auVar39,auVar12);
  auVar32 = psubsw(auVar39,auVar12);
  auVar39 = paddsw(auVar44,auVar54);
  auVar44 = psubsw(auVar44,auVar54);
  auVar37._0_12_ = auVar4._0_12_;
  auVar37._12_2_ = auVar4._6_2_;
  auVar37._14_2_ = auVar52._6_2_;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar4._0_10_;
  auVar36._10_2_ = auVar52._4_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar4._0_8_;
  auVar35._8_2_ = auVar4._4_2_;
  auVar34._8_8_ = auVar35._8_8_;
  auVar34._6_2_ = auVar52._2_2_;
  auVar34._4_2_ = auVar4._2_2_;
  auVar34._0_2_ = auVar4._0_2_;
  auVar34._2_2_ = auVar52._0_2_;
  auVar6._2_2_ = auVar52._8_2_;
  auVar6._0_2_ = auVar4._8_2_;
  auVar6._4_2_ = auVar4._10_2_;
  auVar6._6_2_ = auVar52._10_2_;
  auVar6._8_2_ = auVar4._12_2_;
  auVar6._10_2_ = auVar52._12_2_;
  auVar6._12_2_ = auVar4._14_2_;
  auVar6._14_2_ = auVar52._14_2_;
  auVar55._8_4_ = 0xb50f4b0;
  auVar55._0_8_ = 0xb50f4b00b50f4b0;
  auVar55._12_4_ = 0xb50f4b0;
  auVar52 = pmaddwd(auVar34,auVar55);
  auVar54 = pmaddwd(auVar55,auVar6);
  auVar12 = pmaddwd(auVar34,auVar49);
  auVar4 = pmaddwd(auVar6,auVar49);
  auVar42._0_4_ = auVar52._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar52._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar52._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar52._12_4_ + 0x800 >> 0xc;
  auVar56._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar42,auVar56);
  auVar38._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar38,auVar12);
  alVar5 = (__m128i)paddsw(auVar41,auVar7);
  *output = alVar5;
  alVar5 = (__m128i)psubsw(auVar41,auVar7);
  output[7] = alVar5;
  alVar5 = (__m128i)paddsw(auVar39,auVar4);
  output[1] = alVar5;
  alVar5 = (__m128i)psubsw(auVar39,auVar4);
  output[6] = alVar5;
  alVar5 = (__m128i)paddsw(auVar44,auVar6);
  output[2] = alVar5;
  alVar5 = (__m128i)psubsw(auVar44,auVar6);
  output[5] = alVar5;
  alVar5 = (__m128i)paddsw(auVar32,auVar47);
  output[3] = alVar5;
  alVar5 = (__m128i)psubsw(auVar32,auVar47);
  output[4] = alVar5;
  return;
}

Assistant:

void av1_idct8_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[0];
  x[1] = input[4];
  x[2] = input[2];
  x[3] = input[6];
  x[4] = input[1];
  x[5] = input[5];
  x[6] = input[3];
  x[7] = input[7];

  // stage 2
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);

  // stage 3
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);

  // stage 4
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);

  // stage 5
  btf_16_adds_subs_out_sse2(output[0], output[7], x[0], x[7]);
  btf_16_adds_subs_out_sse2(output[1], output[6], x[1], x[6]);
  btf_16_adds_subs_out_sse2(output[2], output[5], x[2], x[5]);
  btf_16_adds_subs_out_sse2(output[3], output[4], x[3], x[4]);
}